

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseSession.cpp
# Opt level: O3

Result __thiscall
tonk::ApplicationSession::tonk_connect
          (ApplicationSession *this,TonkConnectionConfig config,char *serverHostname,
          uint16_t serverPort,TonkConnection *connectionOut)

{
  long lVar1;
  undefined1 auVar2 [8];
  Connection *this_00;
  _func_int **pp_Var3;
  undefined8 *in_R8;
  undefined1 auVar4 [32];
  undefined1 local_a8 [8];
  undefined1 local_a0 [16];
  undefined1 auStack_90 [32];
  undefined1 local_70 [48];
  undefined4 local_40;
  RefCounter *local_38;
  
  MakeCallbacksOptional(&config);
  (this->super_INATPortPool)._vptr_INATPortPool = (_func_int **)0x0;
  this_00 = (Connection *)operator_new(0xc930,(nothrow_t *)&std::nothrow);
  if (this_00 == (Connection *)0x0) {
    *in_R8 = 0;
    local_a0._0_8_ = local_a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Out of memory","");
    pp_Var3 = (_func_int **)operator_new(0x38);
    *pp_Var3 = (_func_int *)"ApplicationSession::tonk_connect";
    pp_Var3[1] = (_func_int *)(pp_Var3 + 3);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pp_Var3 + 1),local_a0._0_8_,(pointer)(local_a0._8_8_ + local_a0._0_8_));
    *(undefined4 *)(pp_Var3 + 5) = 0;
    pp_Var3[6] = (_func_int *)0x2;
    (this->super_INATPortPool)._vptr_INATPortPool = pp_Var3;
    local_a8 = (undefined1  [8])0x0;
    Result::~Result((Result *)local_a8);
    if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
      operator_delete((void *)local_a0._0_8_);
    }
  }
  else {
    Connection::Connection(this_00);
    auVar4 = vpbroadcastq_avx512vl();
    _local_a0 = vpaddq_avx2(auVar4,_DAT_00195540);
    auStack_90._16_8_ = serverHostname + 0x39d0;
    *in_R8 = this_00;
    auStack_90._24_8_ = *(undefined8 *)(serverHostname + 0x3ab8);
    local_70._0_8_ = *(undefined8 *)(serverHostname + 0x60);
    local_70._8_8_ = *(undefined8 *)(serverHostname + 0x68);
    lVar1 = *(long *)(serverHostname + 0x68);
    if (lVar1 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
      }
    }
    local_70._32_16_ = ZEXT816(0) << 0x20;
    local_70._16_8_ = (char *)0x0;
    local_40._0_1_ = (__atomic_base<bool>)0x0;
    local_40._1_3_ = 0;
    local_70._24_8_ = (__pthread_internal_list *)0x2;
    local_38 = (RefCounter *)serverHostname;
    Connection::InitializeOutgoingConnection
              ((Connection *)local_a8,(Dependencies *)this_00,(TonkSocketConfig *)local_a0,
               (TonkConnectionConfig *)(serverHostname + 0x3800),(char *)&config,serverPort);
    auVar2 = local_a8;
    local_a8 = (undefined1  [8])0x0;
    (this->super_INATPortPool)._vptr_INATPortPool = (_func_int **)auVar2;
    Result::~Result((Result *)local_a8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
    }
    if (auVar2 == (undefined1  [8])0x0) {
      return (Result)(ErrorResult *)this;
    }
    (*(this_00->super_IConnection)._vptr_IConnection[1])(this_00);
  }
  *in_R8 = 0;
  return (Result)(ErrorResult *)this;
}

Assistant:

Result ApplicationSession::tonk_connect(
    TonkConnectionConfig config,
    const char* serverHostname,
    uint16_t serverPort,
    TonkConnection* connectionOut)
{
    MakeCallbacksOptional(config);

    Result result;

    Connection* connection = new (std::nothrow) Connection;
    *connectionOut = reinterpret_cast<TonkConnection>(connection);

    if (!connection)
        result = Result("ApplicationSession::tonk_connect", "Out of memory", ErrorType::Tonk);
    else
    {
        result = connection->InitializeOutgoingConnection({
            &SelfRefCount,
            &MainSocket,
            &MainSocket.AddressMap,
            &IdMap,
            &P2PKeyMap,
            MappedPort.get(),
            Context,
            nullptr, // No FloodDetector backref for outgoing connections
            UDPAddress(), // No Disconnect addr key
            this
        },
            &Config,
            config,
            serverHostname,
            serverPort);
    }

    if (result.IsFail())
    {
        delete connection;
        *connectionOut = nullptr;
    }

    return result;
}